

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wlcAbs.c
# Opt level: O3

Wlc_Ntk_t * Wlc_NtkAbstractNodes(Wlc_Ntk_t *p,Vec_Int_t *vNodesInit)

{
  anon_union_8_2_cb25d913_for_Wlc_Obj_t__8 *paVar1;
  ushort uVar2;
  uint uVar3;
  int iVar4;
  Vec_Int_t *__ptr;
  long lVar5;
  int *piVar6;
  Wlc_Obj_t *pWVar7;
  Wlc_Ntk_t *pNew;
  anon_union_8_2_cb25d913_for_Wlc_Obj_t__8 *paVar8;
  ulong uVar9;
  ulong uVar10;
  
  __ptr = vNodesInit;
  if ((vNodesInit == (Vec_Int_t *)0x0) &&
     (__ptr = Wlc_NtkCollectMultipliers(p), __ptr == (Vec_Int_t *)0x0)) {
    return (Wlc_Ntk_t *)0x0;
  }
  if (0 < __ptr->nSize) {
    lVar5 = 0;
    do {
      iVar4 = __ptr->pArray[lVar5];
      if (((long)iVar4 < 1) || (p->nObjsAlloc <= iVar4)) goto LAB_002f18e2;
      *(ushort *)(p->pObjs + iVar4) = *(ushort *)(p->pObjs + iVar4) | 0x80;
      lVar5 = lVar5 + 1;
    } while (lVar5 < __ptr->nSize);
  }
  uVar3 = p->nObjsAlloc;
  if ((p->vCopies).nCap < (int)uVar3) {
    piVar6 = (p->vCopies).pArray;
    if (piVar6 == (int *)0x0) {
      piVar6 = (int *)malloc((long)(int)uVar3 << 2);
    }
    else {
      piVar6 = (int *)realloc(piVar6,(long)(int)uVar3 << 2);
    }
    (p->vCopies).pArray = piVar6;
    if (piVar6 == (int *)0x0) {
      __assert_fail("p->pArray",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecInt.h"
                    ,0x20c,"void Vec_IntGrow(Vec_Int_t *, int)");
    }
    (p->vCopies).nCap = uVar3;
  }
  if (0 < (int)uVar3) {
    memset((p->vCopies).pArray,0,(ulong)uVar3 * 4);
  }
  (p->vCopies).nSize = uVar3;
  if (1 < p->iObj) {
    uVar10 = 1;
    do {
      if ((long)p->nObjsAlloc <= (long)uVar10) {
LAB_002f18e2:
        __assert_fail("Id > 0 && Id < p->nObjsAlloc",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/wlc/wlc.h"
                      ,0x9d,"Wlc_Obj_t *Wlc_NtkObj(Wlc_Ntk_t *, int)");
      }
      if (uVar10 == (uint)(p->vCopies).nSize) break;
      pWVar7 = p->pObjs + uVar10;
      uVar2 = *(ushort *)pWVar7;
      if ((char)uVar2 < '\0') {
        *(ushort *)pWVar7 = uVar2 & 0xff7f;
        iVar4 = Wlc_ObjAlloc(p,1,uVar2 >> 6 & 1,pWVar7->End - pWVar7->Beg,0);
      }
      else {
        uVar9 = (ulong)pWVar7->nFanins;
        if (0 < (int)pWVar7->nFanins) {
          paVar1 = &pWVar7->field_8;
          lVar5 = 0;
          do {
            if ((2 < (uint)uVar9) ||
               (paVar8 = paVar1,
               (undefined1  [24])((undefined1  [24])*pWVar7 & (undefined1  [24])0x3f) ==
               (undefined1  [24])0x6)) {
              paVar8 = (anon_union_8_2_cb25d913_for_Wlc_Obj_t__8 *)paVar1->pFanins[0];
            }
            iVar4 = paVar8->Fanins[lVar5];
            if (((long)iVar4 < 0) || ((p->vCopies).nSize <= iVar4)) {
              __assert_fail("i >= 0 && i < p->nSize",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecInt.h"
                            ,0x19e,"int Vec_IntEntry(Vec_Int_t *, int)");
            }
            if ((2 < (uint)uVar9) ||
               (paVar8 = paVar1,
               (undefined1  [24])((undefined1  [24])*pWVar7 & (undefined1  [24])0x3f) ==
               (undefined1  [24])0x6)) {
              paVar8 = (anon_union_8_2_cb25d913_for_Wlc_Obj_t__8 *)paVar1->pFanins[0];
            }
            paVar8->Fanins[lVar5] = (p->vCopies).pArray[iVar4];
            lVar5 = lVar5 + 1;
            uVar9 = (ulong)(int)pWVar7->nFanins;
          } while (lVar5 < (long)uVar9);
        }
        iVar4 = (int)uVar10;
      }
      if ((long)(p->vCopies).nSize <= (long)uVar10) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecInt.h"
                      ,0x1c0,"void Vec_IntWriteEntry(Vec_Int_t *, int, int)");
      }
      (p->vCopies).pArray[uVar10] = iVar4;
      uVar10 = uVar10 + 1;
    } while ((long)uVar10 < (long)p->iObj);
  }
  if (__ptr != vNodesInit) {
    if (__ptr->pArray != (int *)0x0) {
      free(__ptr->pArray);
    }
    free(__ptr);
  }
  pNew = Wlc_NtkDupDfs(p);
  Wlc_NtkTransferNames(pNew,p);
  return pNew;
}

Assistant:

Wlc_Ntk_t * Wlc_NtkAbstractNodes( Wlc_Ntk_t * p, Vec_Int_t * vNodesInit )
{
    Vec_Int_t * vNodes = vNodesInit;
    Wlc_Ntk_t * pNew;
    Wlc_Obj_t * pObj;
    int i, k, iObj, iFanin;
    // get multipliers if not given
    if ( vNodes == NULL )
        vNodes = Wlc_NtkCollectMultipliers( p );
    if ( vNodes == NULL )
        return NULL;
    // mark nodes
    Wlc_NtkForEachObjVec( vNodes, p, pObj, i )
        pObj->Mark = 1;
    // iterate through the nodes in the DFS order
    Wlc_NtkCleanCopy( p );
    Wlc_NtkForEachObj( p, pObj, i )
    {
        if ( i == Vec_IntSize(&p->vCopies) )
            break;
        if ( pObj->Mark ) {
            // clean
            pObj->Mark = 0;
            // add fresh PI with the same number of bits
            iObj = Wlc_ObjAlloc( p, WLC_OBJ_PI, Wlc_ObjIsSigned(pObj), Wlc_ObjRange(pObj) - 1, 0 );
        }
        else {
            // update fanins 
            Wlc_ObjForEachFanin( pObj, iFanin, k )
                Wlc_ObjFanins(pObj)[k] = Wlc_ObjCopy(p, iFanin);
            // node to remain
            iObj = i;
        }
        Wlc_ObjSetCopy( p, i, iObj );
    }
    // POs do not change in this procedure
    if ( vNodes != vNodesInit )
        Vec_IntFree( vNodes );
    // reconstruct topological order
    pNew = Wlc_NtkDupDfs( p );
    Wlc_NtkTransferNames( pNew, p );
    return pNew;
}